

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

MppBufferGroupImpl * mpp_buffer_get_misc_group(MppBufferMode mode,MppBufferType type)

{
  RK_U32 id;
  int iVar1;
  MppBufferService *pMVar2;
  MppBufferGroupImpl *pMVar3;
  char *pcVar4;
  char *pcVar5;
  MppBufferType MVar6;
  AutoMutex auto_lock;
  char tag [32];
  
  MVar6 = type & 0xffff;
  if (MVar6 == MPP_BUFFER_TYPE_NORMAL) {
    pMVar3 = (MppBufferGroupImpl *)0x0;
  }
  else {
    if (1 < (int)mode) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "mode < MPP_BUFFER_MODE_BUTT","mpp_buffer_get_misc_group",0x361);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00159d36;
    }
    if (MPP_BUFFER_TYPE_DMA_HEAP < MVar6) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "buf_type < MPP_BUFFER_TYPE_BUTT","mpp_buffer_get_misc_group",0x362);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00159d36:
        abort();
      }
    }
    auto_lock.mLock = MppBufferService::get_lock();
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    pMVar2 = MppBufferService::get_instance();
    id = MppBufferService::get_misc(pMVar2,mode,type);
    if (id == 0) {
      builtin_strncpy(tag,"misc",5);
      pcVar5 = "na";
      if (MVar6 == MPP_BUFFER_TYPE_DRM) {
        pcVar5 = "drm";
      }
      pcVar4 = "ion";
      if (MVar6 != MPP_BUFFER_TYPE_ION) {
        pcVar4 = pcVar5;
      }
      iVar1 = snprintf(tag + 4,0x1c,"_%s",pcVar4);
      pcVar5 = "parser_subsps_ext";
      if (mode == MPP_BUFFER_INTERNAL) {
        pcVar5 = "enable_order_hint";
      }
      snprintf(tag + (long)iVar1 + 4,0x1c - (long)iVar1,"_%s",pcVar5 + 0xe);
      pMVar2 = MppBufferService::get_instance();
      pMVar3 = MppBufferService::get_group(pMVar2,tag,"mpp_buffer_get_misc_group",mode,type,1);
    }
    else {
      pMVar2 = MppBufferService::get_instance();
      pMVar3 = MppBufferService::get_group_by_id(pMVar2,id);
    }
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return pMVar3;
}

Assistant:

MppBufferGroupImpl *mpp_buffer_get_misc_group(MppBufferMode mode, MppBufferType type)
{
    MppBufferGroupImpl *misc;
    RK_U32 id;
    MppBufferType buf_type;

    buf_type = (MppBufferType)(type & MPP_BUFFER_TYPE_MASK);
    if (buf_type == MPP_BUFFER_TYPE_NORMAL)
        return NULL;

    mpp_assert(mode < MPP_BUFFER_MODE_BUTT);
    mpp_assert(buf_type < MPP_BUFFER_TYPE_BUTT);

    AutoMutex auto_lock(MppBufferService::get_lock());

    id = MppBufferService::get_instance()->get_misc(mode, type);
    if (!id) {
        char tag[32];
        RK_S32 offset = 0;

        offset += snprintf(tag + offset, sizeof(tag) - offset, "misc");
        offset += snprintf(tag + offset, sizeof(tag) - offset, "_%s",
                           buf_type == MPP_BUFFER_TYPE_ION ? "ion" :
                           buf_type == MPP_BUFFER_TYPE_DRM ? "drm" : "na");
        offset += snprintf(tag + offset, sizeof(tag) - offset, "_%s",
                           mode == MPP_BUFFER_INTERNAL ? "int" : "ext");

        misc = MppBufferService::get_instance()->get_group(tag, __FUNCTION__, mode, type, 1);
    } else
        misc = MppBufferService::get_instance()->get_group_by_id(id);

    return misc;
}